

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O1

void __thiscall chrono::utils::ChChaseCamera::Zoom(ChChaseCamera *this,int val)

{
  State SVar1;
  double dVar2;
  
  if (val == 0) {
    return;
  }
  SVar1 = this->m_state;
  if (Follow < SVar1) {
    if (SVar1 == Track) {
      return;
    }
    if (SVar1 == Inside) {
      if (val < 1) {
        return;
      }
      (this->m_lastLoc).m_data[0] = (this->m_loc).m_data[0];
      dVar2 = (this->m_loc).m_data[2];
      (this->m_lastLoc).m_data[1] = (this->m_loc).m_data[1];
      (this->m_lastLoc).m_data[2] = dVar2;
      this->m_state = Chase;
      this->m_angle = 0.0;
      return;
    }
    goto LAB_0094d750;
  }
  if ((-1 < val) || (this->m_mult <= this->m_minMult)) {
    if ((0 < val) && (this->m_mult < this->m_maxMult)) {
      dVar2 = this->m_mult * 1.01;
      goto LAB_0094d6ef;
    }
  }
  else {
    dVar2 = this->m_mult / 1.01;
LAB_0094d6ef:
    this->m_mult = dVar2;
  }
  if (this->m_mult <= this->m_minMult) {
    if (SVar1 == Free) {
      this->m_mult = 1.0;
      this->m_angle = 0.0;
    }
    (this->m_lastLoc).m_data[0] = (this->m_loc).m_data[0];
    dVar2 = (this->m_loc).m_data[2];
    (this->m_lastLoc).m_data[1] = (this->m_loc).m_data[1];
    (this->m_lastLoc).m_data[2] = dVar2;
    this->m_state = Inside;
  }
LAB_0094d750:
  if (this->m_state == Free) {
    if (val < 0) {
      dVar2 = this->m_mult + 0.01;
    }
    else {
      dVar2 = this->m_mult + -0.01;
    }
    this->m_mult = dVar2;
  }
  return;
}

Assistant:

void ChChaseCamera::Zoom(int val) {
    if (val == 0 || m_state == Track)
        return;

    if (m_state == Inside) {
        if (val > 0)
            SetState(Chase);
        return;
    }
        
    if (m_state == Chase || m_state == Follow) {
        if (val < 0 && m_mult > m_minMult)
            m_mult /= 1.01;
        else if (val > 0 && m_mult < m_maxMult)
            m_mult *= 1.01;

        if (m_mult <= m_minMult)
            SetState(Inside);
    }

    if (m_state == Free) {
        if (val < 0)
            m_mult += 0.01;
        else
            m_mult -= 0.01;
    }

}